

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_base64.c
# Opt level: O3

char * cmime_base64_encode_string(char *source)

{
  undefined8 in_RAX;
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  int len;
  uchar uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  undefined8 local_38;
  uchar out [4];
  uchar in [3];
  
  local_38 = in_RAX;
  sVar1 = strlen(source);
  uVar7 = (uint)sVar1;
  pcVar2 = (char *)calloc((long)(int)((double)(int)uVar7 * 0.35 + (double)(int)uVar7 + 1.0),2);
  if (0 < (int)uVar7) {
    uVar5 = 0;
    lVar6 = 0;
    do {
      lVar3 = 0;
      len = 0;
      do {
        if (uVar5 + lVar3 < (ulong)(uVar7 & 0x7fffffff)) {
          uVar4 = source[lVar3 + uVar5];
          len = len + 1;
        }
        else {
          uVar4 = '\0';
        }
        out[lVar3 + -3] = uVar4;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      cmime_base64_encode_block((uchar *)((long)&local_38 + 5),(uchar *)&local_38,len);
      *(undefined4 *)(pcVar2 + (int)lVar6) = (undefined4)local_38;
      lVar6 = (long)(int)lVar6 + 4;
      uVar5 = uVar5 + 3;
    } while (uVar5 < (uVar7 & 0x7fffffff));
  }
  return pcVar2;
}

Assistant:

char *cmime_base64_encode_string(const char *source) {
    unsigned char in[3], out[4];
    int i,j;
    int len;
    char *target = NULL;
    int pos = 0;

    /* laenge der ein/ausgabe */
    int source_len = strlen(source);
    int target_len = source_len + (0.35 * source_len) + 1;

    target = (char *)calloc(target_len, sizeof(char) + 1);

    for(j=0; j<source_len; j+=3) {
        len = 0;

        for(i=0; i<3; i++) {
            if((i + j) < source_len) {
                in[i] = (unsigned char)source[j + i];
                len++;
            } else {
                in[i] = 0;
            }
        }

        cmime_base64_encode_block(in, out, len);
        for(i=0; i<4; i++) {
            target[pos++] = out[i];
        }
    }

    return(target);
}